

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_mul_restartable
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,mbedtls_ecp_restart_ctx *rs_ctx
              )

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  mbedtls_mpi *X_00;
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  mbedtls_ecp_point *P_00;
  byte bVar10;
  uchar swap;
  size_t sVar11;
  mbedtls_ecp_point *pmVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  mbedtls_ecp_point *R_00;
  byte bVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  mbedtls_mpi AA;
  mbedtls_mpi B;
  mbedtls_ecp_point RP;
  mbedtls_mpi BB;
  mbedtls_mpi DA;
  mbedtls_mpi E;
  mbedtls_mpi A;
  mbedtls_mpi D;
  mbedtls_mpi C;
  size_t local_298;
  mbedtls_mpi local_258;
  mbedtls_mpi local_240;
  mbedtls_ecp_point local_228 [3];
  mbedtls_mpi local_120;
  mbedtls_mpi local_108;
  mbedtls_mpi local_f0;
  mbedtls_mpi local_d8;
  mbedtls_ecp_point local_c0;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  iVar3 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar3 != 0) {
    return iVar3;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    mbedtls_mpi_init(&local_228[0].X);
    mbedtls_mpi_init(&local_228[0].Y);
    mbedtls_mpi_init(&local_228[0].Z);
    mbedtls_mpi_init(&local_48);
    iVar3 = mbedtls_mpi_copy(&local_48,&P->X);
    if (((iVar3 == 0) && (iVar3 = mbedtls_ecp_copy(local_228,P), iVar3 == 0)) &&
       (iVar3 = mbedtls_mpi_lset(&R->X,1), iVar3 == 0)) {
      X = &R->Z;
      iVar3 = mbedtls_mpi_lset(X,0);
      if (iVar3 == 0) {
        mbedtls_mpi_free(&R->Y);
        Y = &grp->P;
        do {
          iVar3 = mbedtls_mpi_cmp_mpi(&local_228[0].X,Y);
          if (iVar3 < 0) {
            if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
               (iVar3 = ecp_randomize_mxz(grp,local_228,f_rng,p_rng), iVar3 == 0)) {
              local_298 = mbedtls_mpi_bitlen(m);
              goto LAB_00128f7a;
            }
            break;
          }
          iVar3 = mbedtls_mpi_sub_abs(&local_228[0].X,&local_228[0].X,Y);
        } while (iVar3 == 0);
      }
    }
LAB_00128e89:
    mbedtls_mpi_free(&local_228[0].X);
    mbedtls_mpi_free(&local_228[0].Y);
    mbedtls_mpi_free(&local_228[0].Z);
    mbedtls_mpi_free(&local_48);
    if (iVar3 != 0) {
      return iVar3;
    }
    if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
      return 0;
    }
    if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      return 0;
    }
  }
  iVar3 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  if (iVar3 == 0) {
    iVar3 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar21 = iVar3 == 0;
  }
  else {
    bVar21 = false;
  }
  uVar9 = grp->nbits;
  bVar10 = (bVar21 + '\x01') - (uVar9 < 0x180) | 4;
  uVar6 = 2;
  if (bVar10 < uVar9) {
    uVar6 = (uint)bVar10;
  }
  uVar13 = (ulong)uVar6;
  uVar18 = 1 << ((byte)(uVar6 - 1) & 0x1f);
  uVar8 = (uVar9 + uVar13) - 1;
  uVar9 = uVar8 / uVar13;
  bVar10 = (byte)uVar18;
  if ((bVar21 == false) || (P_00 = grp->T, P_00 == (mbedtls_ecp_point *)0x0)) {
    P_00 = (mbedtls_ecp_point *)calloc((ulong)uVar18,0x48);
    if (P_00 == (mbedtls_ecp_point *)0x0) {
      iVar3 = -0x4d80;
      goto LAB_00128db9;
    }
    uVar7 = 1;
    do {
      uVar5 = uVar7 - 1 & 0xff;
      mbedtls_mpi_init(&P_00[uVar5].X);
      mbedtls_mpi_init(&P_00[uVar5].Y);
      mbedtls_mpi_init(&P_00[uVar5].Z);
      uVar5 = uVar7 & 0xff;
      uVar7 = uVar5 + 1;
    } while (uVar5 < uVar18);
    iVar3 = mbedtls_ecp_copy(P_00,P);
    if (iVar3 == 0) {
      lVar20 = (uVar6 - 1) * uVar9;
      if (lVar20 != 0) {
        uVar19 = 0;
        do {
          uVar6 = 1 << ((byte)(uVar19 / uVar9) & 0x1f) & 0xff;
          P = P_00 + uVar6;
          if (((uVar19 % uVar9 == 0) &&
              (iVar3 = mbedtls_ecp_copy(P,P_00 + (uVar6 >> 1)), iVar3 != 0)) ||
             (iVar3 = ecp_double_jac(grp,P,P), iVar3 != 0)) goto LAB_00128d77;
          uVar19 = uVar19 + 1;
        } while (lVar20 - uVar19 != 0);
      }
      uVar6 = uVar18 & 0xff;
      if (uVar6 < 2) {
        iVar3 = ecp_normalize_jac(grp,P);
        if (iVar3 == 0) {
          sVar11 = 0;
          goto LAB_00128b46;
        }
      }
      else {
        uVar7 = 1;
        sVar11 = 0;
        do {
          *(mbedtls_ecp_point **)(&local_228[0].X.s + sVar11 * 2) = P_00 + uVar7;
          sVar11 = sVar11 + 1;
          uVar7 = uVar7 * 2 & 0xff;
        } while (uVar7 < uVar6);
        iVar3 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)local_228,sVar11);
        if (iVar3 == 0) {
          bVar15 = 1;
          do {
            lVar20 = (ulong)bVar15 + 1;
            pmVar12 = P_00 + ((ulong)bVar15 - 1);
            R_00 = (mbedtls_ecp_point *)((long)&P_00[-1].X.s + (ulong)((uint)bVar15 * 0x90));
            while (lVar20 = lVar20 + -1, lVar20 != 0) {
              iVar3 = ecp_add_mixed(grp,R_00,pmVar12,P_00 + bVar15);
              pmVar12 = pmVar12 + -1;
              R_00 = R_00 + -1;
              if (iVar3 != 0) goto LAB_00128d77;
            }
            bVar15 = bVar15 * '\x02';
          } while (bVar15 < bVar10);
          sVar11 = 0;
          pmVar12 = P_00;
          do {
            pmVar12 = pmVar12 + 1;
            *(mbedtls_ecp_point **)(&local_228[0].X.s + sVar11 * 2) = pmVar12;
            sVar11 = sVar11 + 1;
          } while ((ulong)uVar6 - 1 != sVar11);
LAB_00128b46:
          iVar3 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)local_228,sVar11);
          if (iVar3 == 0) {
            if (bVar21 != false) {
              grp->T = P_00;
              grp->T_size = (ulong)uVar6;
            }
            goto LAB_001288a4;
          }
        }
      }
    }
  }
  else {
LAB_001288a4:
    iVar3 = mbedtls_mpi_get_bit(&grp->N,0);
    if (iVar3 == 0) {
      iVar3 = -0x4f80;
    }
    else {
      mbedtls_mpi_init(&local_c0.X);
      mbedtls_mpi_init(&local_258);
      iVar4 = mbedtls_mpi_get_bit(m,0);
      iVar3 = mbedtls_mpi_copy(&local_c0.X,m);
      if (((iVar3 == 0) && (iVar3 = mbedtls_mpi_sub_mpi(&local_258,&grp->N,m), iVar3 == 0)) &&
         (iVar3 = mbedtls_mpi_safe_cond_assign(&local_c0.X,&local_258,iVar4 == 0), iVar3 == 0)) {
        iVar3 = 0;
        memset(local_228,0,uVar9 + 1);
        if (uVar13 <= uVar8) {
          uVar19 = 0;
          do {
            uVar17 = 0;
            do {
              iVar3 = mbedtls_mpi_get_bit(&local_c0.X,uVar17 * uVar9 + uVar19);
              pbVar1 = (byte *)((long)&local_228[0].X.s + uVar19);
              *pbVar1 = *pbVar1 | (byte)(iVar3 << ((byte)uVar17 & 0x1f));
              uVar17 = uVar17 + 1;
            } while (uVar13 != uVar17);
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar9);
          iVar3 = 0;
          uVar19 = 0;
          bVar15 = 0;
          do {
            bVar2 = *(byte *)((long)&local_228[0].X.s + uVar19 + 1);
            bVar16 = bVar2 ^ bVar15;
            bVar14 = (~bVar16 & 1) * (byte)local_228[0].X.s;
            bVar15 = bVar14 & bVar16 | bVar2 & bVar15;
            bVar14 = bVar16 ^ bVar14;
            *(byte *)((long)&local_228[0].X.s + uVar19 + 1) = bVar14;
            *(byte *)((long)&local_228[0].X.s + uVar19) = ~bVar16 << 7 | (byte)local_228[0].X.s;
            uVar19 = uVar19 + 1;
            local_228[0].X.s._0_1_ = bVar14;
          } while (uVar9 != uVar19);
        }
      }
      mbedtls_mpi_free(&local_258);
      mbedtls_mpi_free(&local_c0.X);
      if (iVar3 == 0) {
        mbedtls_mpi_init(&local_c0.X);
        mbedtls_mpi_init(&local_c0.Y);
        mbedtls_mpi_init(&local_c0.Z);
        iVar3 = ecp_select_comb(grp,R,P_00,bVar10,*(uchar *)((long)&local_228[0].X.s + uVar9));
        if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_lset(&R->Z,1), iVar3 == 0)) {
          if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
            iVar3 = 0;
            if (uVar13 <= uVar8) goto LAB_00128ef0;
          }
          else {
            iVar3 = ecp_randomize_jac(grp,R,f_rng,p_rng);
            if (uVar13 <= uVar8 && iVar3 == 0) {
LAB_00128ef0:
              while (iVar3 = ecp_double_jac(grp,R,R), iVar3 == 0) {
                uVar8 = uVar9 - 1;
                iVar3 = ecp_select_comb(grp,&local_c0,P_00,bVar10,
                                        *(uchar *)((long)local_228 + (uVar9 - 1)));
                if (((iVar3 != 0) || (iVar3 = ecp_add_mixed(grp,R,R,&local_c0), iVar3 != 0)) ||
                   (uVar9 = uVar8, uVar8 == 0)) break;
              }
            }
          }
        }
        mbedtls_mpi_free(&local_c0.X);
        mbedtls_mpi_free(&local_c0.Y);
        mbedtls_mpi_free(&local_c0.Z);
        if (((iVar3 == 0) && (iVar3 = ecp_safe_invert_jac(grp,R,iVar4 == 0), iVar3 == 0)) &&
           ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
            (iVar3 = ecp_randomize_jac(grp,R,f_rng,p_rng), iVar3 == 0)))) {
          iVar3 = ecp_normalize_jac(grp,R);
        }
      }
    }
  }
LAB_00128d77:
  if (P_00 != grp->T) {
    lVar20 = 0;
    do {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(P_00->X).s + lVar20));
      lVar20 = lVar20 + 0x48;
    } while ((ulong)((uVar18 & 0xff) + (uint)((uVar18 & 0xff) == 0)) * 0x48 != lVar20);
    free(P_00);
  }
  if (iVar3 == 0) {
    return 0;
  }
LAB_00128db9:
  mbedtls_ecp_point_free(R);
  return iVar3;
LAB_00128f7a:
  bVar21 = local_298 == 0;
  local_298 = local_298 - 1;
  if (bVar21) {
    if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
       (iVar3 = ecp_randomize_mxz(grp,R,f_rng,p_rng), iVar3 == 0)) {
      iVar3 = ecp_normalize_mxz(grp,R);
    }
    goto LAB_00128e89;
  }
  iVar3 = mbedtls_mpi_get_bit(m,local_298);
  swap = (uchar)iVar3;
  iVar3 = mbedtls_mpi_safe_cond_swap(&R->X,&local_228[0].X,swap);
  if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_safe_cond_swap(X,&local_228[0].Z,swap), iVar3 != 0))
  goto LAB_00128e89;
  mbedtls_mpi_init(&local_c0.X);
  mbedtls_mpi_init(&local_258);
  mbedtls_mpi_init(&local_240);
  mbedtls_mpi_init(&local_120);
  mbedtls_mpi_init(&local_d8);
  mbedtls_mpi_init(&local_60);
  mbedtls_mpi_init(&local_78);
  mbedtls_mpi_init(&local_f0);
  mbedtls_mpi_init(&local_108);
  iVar3 = mbedtls_mpi_add_mpi(&local_c0.X,&R->X,X);
  while (iVar3 == 0) {
    iVar3 = mbedtls_mpi_cmp_mpi(&local_c0.X,Y);
    if (iVar3 < 0) {
      iVar3 = mbedtls_mpi_mul_mpi(&local_258,&local_c0.X,&local_c0.X);
      if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_258,grp), iVar3 == 0)) {
        mul_count = mul_count + 1;
        iVar3 = mbedtls_mpi_sub_mpi(&local_240,&R->X,X);
        goto joined_r0x001291ae;
      }
      break;
    }
    iVar3 = mbedtls_mpi_sub_abs(&local_c0.X,&local_c0.X,Y);
  }
LAB_0012908f:
  mbedtls_mpi_free(&local_c0.X);
  mbedtls_mpi_free(&local_258);
  mbedtls_mpi_free(&local_240);
  mbedtls_mpi_free(&local_120);
  mbedtls_mpi_free(&local_d8);
  mbedtls_mpi_free(&local_60);
  mbedtls_mpi_free(&local_78);
  mbedtls_mpi_free(&local_f0);
  mbedtls_mpi_free(&local_108);
  if (((iVar3 != 0) || (iVar3 = mbedtls_mpi_safe_cond_swap(&R->X,&local_228[0].X,swap), iVar3 != 0))
     || (iVar3 = mbedtls_mpi_safe_cond_swap(X,&local_228[0].Z,swap), iVar3 != 0)) goto LAB_00128e89;
  goto LAB_00128f7a;
joined_r0x001291ae:
  if (iVar3 != 0) goto LAB_0012908f;
  if ((-1 < local_240.s) || (iVar3 = mbedtls_mpi_cmp_int(&local_240,0), iVar3 == 0)) {
    iVar3 = mbedtls_mpi_mul_mpi(&local_120,&local_240,&local_240);
    if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_120,grp), iVar3 == 0)) {
      mul_count = mul_count + 1;
      iVar3 = mbedtls_mpi_sub_mod(grp,&local_d8,&local_258,&local_120);
      if ((((((iVar3 == 0) &&
             (iVar3 = mbedtls_mpi_add_mod(grp,&local_60,&local_228[0].X,&local_228[0].Z), iVar3 == 0
             )) && (iVar3 = mbedtls_mpi_sub_mod(grp,&local_78,&local_228[0].X,&local_228[0].Z),
                   iVar3 == 0)) &&
           ((iVar3 = mbedtls_mpi_mul_mod(grp,&local_f0,&local_78,&local_c0.X), iVar3 == 0 &&
            (iVar3 = mbedtls_mpi_mul_mod(grp,&local_108,&local_60,&local_240), iVar3 == 0)))) &&
          (iVar3 = mbedtls_mpi_add_mpi(&local_228[0].X,&local_f0,&local_108), iVar3 == 0)) &&
         (iVar3 = ecp_modp(&local_228[0].X,grp), iVar3 == 0)) {
        mul_count = mul_count + 1;
        iVar3 = mbedtls_mpi_mul_mod(grp,&local_228[0].X,&local_228[0].X,&local_228[0].X);
        if ((iVar3 == 0) &&
           (iVar3 = mbedtls_mpi_sub_mod(grp,&local_228[0].Z,&local_f0,&local_108), iVar3 == 0)) {
          X_00 = &local_228[0].Z;
          iVar3 = mbedtls_mpi_mul_mod(grp,X_00,X_00,X_00);
          if (((iVar3 == 0) &&
              (((iVar3 = mbedtls_mpi_mul_mod(grp,&local_228[0].Z,&local_48,&local_228[0].Z),
                iVar3 == 0 &&
                (iVar3 = mbedtls_mpi_mul_mod(grp,&R->X,&local_258,&local_120), iVar3 == 0)) &&
               (iVar3 = mbedtls_mpi_mul_mod(grp,X,&grp->A,&local_d8), iVar3 == 0)))) &&
             (iVar3 = mbedtls_mpi_add_mod(grp,X,&local_120,X), iVar3 == 0)) {
            iVar3 = mbedtls_mpi_mul_mod(grp,X,&local_d8,X);
          }
        }
      }
    }
    goto LAB_0012908f;
  }
  iVar3 = mbedtls_mpi_add_mpi(&local_240,&local_240,Y);
  goto joined_r0x001291ae;
}

Assistant:

int mbedtls_ecp_mul_restartable( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng,
             mbedtls_ecp_restart_ctx *rs_ctx )
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif
    ECP_VALIDATE_RET( grp != NULL );
    ECP_VALIDATE_RET( R   != NULL );
    ECP_VALIDATE_RET( m   != NULL );
    ECP_VALIDATE_RET( P   != NULL );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* reset ops count for this call if top-level */
    if( rs_ctx != NULL && rs_ctx->depth++ == 0 )
        rs_ctx->ops_done = 0;
#endif

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if( ( is_grp_capable = mbedtls_internal_ecp_grp_capable( grp ) ) )
        MBEDTLS_MPI_CHK( mbedtls_internal_ecp_init( grp ) );
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* skip argument check when restarting */
    if( rs_ctx == NULL || rs_ctx->rsm == NULL )
#endif
    {
        /* check_privkey is free */
        MBEDTLS_ECP_BUDGET( MBEDTLS_ECP_OPS_CHK );

        /* Common sanity checks */
        MBEDTLS_MPI_CHK( mbedtls_ecp_check_privkey( grp, m ) );
        MBEDTLS_MPI_CHK( mbedtls_ecp_check_pubkey( grp, P ) );
    }

    ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
        MBEDTLS_MPI_CHK( ecp_mul_mxz( grp, R, m, P, f_rng, p_rng ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
        MBEDTLS_MPI_CHK( ecp_mul_comb( grp, R, m, P, f_rng, p_rng, rs_ctx ) );
#endif

cleanup:

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if( is_grp_capable )
        mbedtls_internal_ecp_free( grp );
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( rs_ctx != NULL )
        rs_ctx->depth--;
#endif

    return( ret );
}